

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O2

void Imath_2_5::extractEulerXYZ<float>(Matrix44<float> *mat,Vec3<float> *rot)

{
  float fVar1;
  Vec3<float> local_120;
  Vec3<float> local_110;
  Vec3<float> local_100;
  Matrix44<float> local_f0;
  undefined1 local_b0 [24];
  float local_98;
  float local_94;
  Vec3<float> local_90;
  undefined8 local_84;
  float afStack_7c [3];
  Matrix44<float> local_70;
  
  local_100.z = mat->x[0][2];
  local_100.x = *(float *)((long)(mat->x + 0) + 0);
  local_100.y = *(float *)((long)(mat->x + 0) + 4);
  local_110.z = mat->x[1][2];
  local_110.x = *(float *)((long)(mat->x + 1) + 0);
  local_110.y = *(float *)((long)(mat->x + 1) + 4);
  local_120.z = mat->x[2][2];
  local_120.x = *(float *)((long)(mat->x + 2) + 0);
  local_120.y = *(float *)((long)(mat->x + 2) + 4);
  Vec3<float>::normalize(&local_100);
  Vec3<float>::normalize(&local_110);
  Vec3<float>::normalize(&local_120);
  local_b0._0_4_ = local_100.x;
  local_b0._4_4_ = local_100.y;
  local_b0._8_4_ = local_100.z;
  local_b0._12_4_ = 0.0;
  local_b0._16_4_ = local_110.x;
  local_b0._20_4_ = local_110.y;
  local_98 = local_110.z;
  local_94 = 0.0;
  local_90.x = local_120.x;
  local_90.y = local_120.y;
  local_90.z = local_120.z;
  local_84._0_4_ = 0.0;
  local_84._4_4_ = 0.0;
  afStack_7c[0] = 0.0;
  afStack_7c[1] = 0.0;
  afStack_7c[2] = 1.0;
  local_f0.x[0][0] = atan2f(local_110.z,local_120.z);
  rot->x = local_f0.x[0][0];
  local_70.x[1][2] = 0.0;
  local_70.x[1][3] = 0.0;
  local_70.x[2][0] = 0.0;
  local_70.x[2][3] = 0.0;
  local_70.x[3][0] = 0.0;
  local_70.x[3][1] = 0.0;
  local_70.x[3][2] = 0.0;
  local_70.x[0][1] = 0.0;
  local_70.x[0][2] = 0.0;
  local_70.x[0][3] = 0.0;
  local_70.x[1][0] = 0.0;
  local_70.x[0][0] = 1.0;
  local_70.x[1][1] = 1.0;
  local_70.x[2][1] = 0.0;
  local_70.x[2][2] = 1.0;
  local_70.x[3][3] = 1.0;
  local_f0.x[0][0] = -local_f0.x[0][0];
  local_f0.x[0][1] = 0.0;
  local_f0.x[0][2] = 0.0;
  Matrix44<float>::rotate<float>(&local_70,(Vec3<float> *)&local_f0);
  Matrix44<float>::operator*(&local_f0,&local_70,(Matrix44<float> *)local_b0);
  local_70.x[1][0] = local_f0.x[1][0];
  local_70.x[1][1] = local_f0.x[1][1];
  fVar1 = atan2f(-local_f0.x[0][2],
                 SQRT(local_f0.x[0][0] * local_f0.x[0][0] + local_f0.x[0][1] * local_f0.x[0][1]));
  rot->y = fVar1;
  fVar1 = atan2f(-local_70.x[1][0],local_70.x[1][1]);
  rot->z = fVar1;
  return;
}

Assistant:

void
extractEulerXYZ (const Matrix44<T> &mat, Vec3<T> &rot)
{
    //
    // Normalize the local x, y and z axes to remove scaling.
    //

    Vec3<T> i (mat[0][0], mat[0][1], mat[0][2]);
    Vec3<T> j (mat[1][0], mat[1][1], mat[1][2]);
    Vec3<T> k (mat[2][0], mat[2][1], mat[2][2]);

    i.normalize();
    j.normalize();
    k.normalize();

    Matrix44<T> M (i[0], i[1], i[2], 0, 
		   j[0], j[1], j[2], 0, 
		   k[0], k[1], k[2], 0, 
		   0,    0,    0,    1);

    //
    // Extract the first angle, rot.x.
    // 

    rot.x = Math<T>::atan2 (M[1][2], M[2][2]);

    //
    // Remove the rot.x rotation from M, so that the remaining
    // rotation, N, is only around two axes, and gimbal lock
    // cannot occur.
    //

    Matrix44<T> N;
    N.rotate (Vec3<T> (-rot.x, 0, 0));
    N = N * M;

    //
    // Extract the other two angles, rot.y and rot.z, from N.
    //

    T cy = Math<T>::sqrt (N[0][0]*N[0][0] + N[0][1]*N[0][1]);
    rot.y = Math<T>::atan2 (-N[0][2], cy);
    rot.z = Math<T>::atan2 (-N[1][0], N[1][1]);
}